

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QList<QWidget_*> * __thiscall
QList<QWidget_*>::operator+=(QList<QWidget_*> *this,QList<QWidget_*> *l)

{
  QList<QWidget_*> *in_RDI;
  QList<QWidget_*> *unaff_retaddr;
  
  append(unaff_retaddr,in_RDI);
  return in_RDI;
}

Assistant:

QList<T> &operator+=(QList<T> &&l) { append(std::move(l)); return *this; }